

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

NullableValue<capnp::Orphan<capnp::compiler::Expression::Param>_> * __thiscall
kj::_::NullableValue<capnp::Orphan<capnp::compiler::Expression::Param>_>::operator=
          (NullableValue<capnp::Orphan<capnp::compiler::Expression::Param>_> *this,
          NullableValue<capnp::Orphan<capnp::compiler::Expression::Param>_> *other)

{
  Orphan<capnp::compiler::Expression::Param> *params;
  NullableValue<capnp::Orphan<capnp::compiler::Expression::Param>_> *other_local;
  NullableValue<capnp::Orphan<capnp::compiler::Expression::Param>_> *this_local;
  
  if (other != this) {
    if ((this->isSet & 1U) != 0) {
      this->isSet = false;
      dtor<capnp::Orphan<capnp::compiler::Expression::Param>>(&(this->field_1).value);
    }
    if ((other->isSet & 1U) != 0) {
      params = mv<capnp::Orphan<capnp::compiler::Expression::Param>>(&(other->field_1).value);
      ctor<capnp::Orphan<capnp::compiler::Expression::Param>,capnp::Orphan<capnp::compiler::Expression::Param>>
                (&(this->field_1).value,params);
      this->isSet = true;
    }
  }
  return this;
}

Assistant:

inline NullableValue& operator=(NullableValue&& other) {
    if (&other != this) {
      // Careful about throwing destructors/constructors here.
      if (isSet) {
        isSet = false;
        dtor(value);
      }
      if (other.isSet) {
        ctor(value, kj::mv(other.value));
        isSet = true;
      }
    }
    return *this;
  }